

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_matrix.c
# Opt level: O3

int main(int argc,char **argv)

{
  char cVar1;
  char *pcVar2;
  int iVar3;
  parasail_matrix_t *ppVar4;
  parasail_matrix_t *ppVar5;
  parasail_matrix_t *matrix;
  long lVar6;
  undefined8 *puVar7;
  undefined8 *puVar8;
  char *pcVar9;
  long lVar10;
  int pssm_values [24];
  undefined8 auStack_78 [12];
  
  puVar7 = &DAT_00102120;
  puVar8 = auStack_78;
  for (lVar6 = 0xc; lVar6 != 0; lVar6 = lVar6 + -1) {
    *puVar8 = *puVar7;
    puVar7 = puVar7 + 1;
    puVar8 = puVar8 + 1;
  }
  if (argc == 2) {
    ppVar4 = (parasail_matrix_t *)parasail_matrix_from_file(argv[1]);
    print_matrix(ppVar4);
    print_mapper((parasail_matrix_t *)ppVar4->mapper);
    parasail_matrix_free(ppVar4);
  }
  else {
    puts("missing matrix file argument, skipping that part of the test");
  }
  print_matrix(&parasail_blosum62);
  print_mapper((parasail_matrix_t *)parasail_blosum_map);
  pcVar9 = "blosum62";
  ppVar4 = (parasail_matrix_t *)parasail_matrix_lookup();
  if (ppVar4 == (parasail_matrix_t *)0x0) {
    main_cold_8();
LAB_00101562:
    main_cold_7();
LAB_00101567:
    main_cold_6();
LAB_0010156c:
    main_cold_5();
LAB_00101571:
    main_cold_4();
LAB_00101576:
    main_cold_1();
  }
  else {
    pcVar9 = "ACGT";
    ppVar5 = (parasail_matrix_t *)parasail_matrix_create("ACGT",2,0xffffffff);
    if (ppVar5 == (parasail_matrix_t *)0x0) goto LAB_00101562;
    print_matrix(ppVar5);
    print_mapper((parasail_matrix_t *)ppVar5->mapper);
    parasail_matrix_free(ppVar5);
    pcVar9 = "AcgT";
    ppVar5 = (parasail_matrix_t *)parasail_matrix_create_case_sensitive("AcgT",2,0xffffffff);
    if (ppVar5 == (parasail_matrix_t *)0x0) goto LAB_00101567;
    print_matrix(ppVar5);
    print_mapper((parasail_matrix_t *)ppVar5->mapper);
    parasail_matrix_free(ppVar5);
    pcVar9 = "ACGTacgt";
    ppVar5 = (parasail_matrix_t *)parasail_matrix_create_case_sensitive("ACGTacgt",2,0xffffffff);
    if (ppVar5 == (parasail_matrix_t *)0x0) goto LAB_0010156c;
    print_matrix(ppVar5);
    print_mapper((parasail_matrix_t *)ppVar5->mapper);
    parasail_matrix_free(ppVar5);
    pcVar9 = (char *)ppVar4;
    ppVar5 = (parasail_matrix_t *)parasail_matrix_copy();
    if (ppVar5 == (parasail_matrix_t *)0x0) goto LAB_00101571;
    pcVar9 = (char *)ppVar5;
    parasail_matrix_set_value(ppVar5,10,10,100);
    if (ppVar5->max != 100) goto LAB_00101576;
    parasail_matrix_free(ppVar5);
    pcVar9 = "abcdef";
    ppVar5 = (parasail_matrix_t *)parasail_matrix_pssm_create("abcdef",auStack_78,4);
    if (ppVar5 != (parasail_matrix_t *)0x0) {
      print_matrix(ppVar5);
      print_mapper((parasail_matrix_t *)ppVar5->mapper);
      pcVar9 = (char *)ppVar5;
      matrix = (parasail_matrix_t *)parasail_matrix_copy();
      if (matrix != (parasail_matrix_t *)0x0) {
        parasail_matrix_free(ppVar5);
        print_matrix(matrix);
        print_mapper((parasail_matrix_t *)matrix->mapper);
        parasail_matrix_free(matrix);
        ppVar5 = (parasail_matrix_t *)parasail_matrix_convert_square_to_pssm(ppVar4,"asdf",4);
        print_matrix(ppVar5);
        print_mapper((parasail_matrix_t *)ppVar5->mapper);
        parasail_matrix_free(ppVar5);
        print_matrix(ppVar4);
        return 0;
      }
      goto LAB_00101580;
    }
  }
  main_cold_3();
LAB_00101580:
  main_cold_2();
  pcVar2 = ((parasail_matrix_t *)pcVar9)->alphabet;
  printf("matrix \'%s\'\n",((parasail_matrix_t *)pcVar9)->name);
  printf("  ");
  if (0 < ((parasail_matrix_t *)pcVar9)->size) {
    lVar6 = 0;
    do {
      printf("%4c",(ulong)(uint)(int)pcVar2[lVar6]);
      lVar6 = lVar6 + 1;
    } while (lVar6 < ((parasail_matrix_t *)pcVar9)->size);
  }
  putchar(10);
  if (0 < ((parasail_matrix_t *)pcVar9)->length) {
    lVar6 = 0;
    do {
      if (((parasail_matrix_t *)pcVar9)->type == 0) {
        cVar1 = pcVar2[lVar6];
LAB_00101621:
        printf("%c ",(ulong)(uint)(int)cVar1);
      }
      else {
        if (((parasail_matrix_t *)pcVar9)->query != (char *)0x0) {
          cVar1 = ((parasail_matrix_t *)pcVar9)->query[lVar6];
          goto LAB_00101621;
        }
        printf("* ");
      }
      iVar3 = ((parasail_matrix_t *)pcVar9)->size;
      if (0 < iVar3) {
        lVar10 = 0;
        do {
          printf("%4d",(ulong)(uint)((parasail_matrix_t *)pcVar9)->matrix
                                    [iVar3 * (int)lVar6 + lVar10]);
          iVar3 = ((parasail_matrix_t *)pcVar9)->size;
          lVar10 = lVar10 + 1;
        } while ((int)lVar10 < iVar3);
      }
      putchar(10);
      lVar6 = lVar6 + 1;
    } while (lVar6 < ((parasail_matrix_t *)pcVar9)->length);
  }
  printf("max = %d\n",(ulong)(uint)((parasail_matrix_t *)pcVar9)->max);
  iVar3 = printf("min = %d\n",(ulong)(uint)((parasail_matrix_t *)pcVar9)->min);
  return iVar3;
}

Assistant:

int main(int argc, char **argv)
{
    parasail_matrix_t *matrix = NULL;
    const parasail_matrix_t *internal_matrix = NULL;
    parasail_matrix_t *user_matrix = NULL;
    parasail_matrix_t *user_matrix_copy = NULL;
    const char *pssm_alphabet = "abcdef";
    const int pssm_values[] = {
        0,  1,  2,  3,   4,  5,
        6,  7,  8,  9,  10, 11,
        12, 13, 14, 15, 16, 17,
        18, 19, 20, 21, 22, 23
    };
    const int pssm_length = 4;

    if (argc == 2) {
        matrix = parasail_matrix_from_file(argv[1]);
        print_matrix(matrix);
        print_mapper(matrix);
        parasail_matrix_free(matrix);
    }
    else {
        printf("missing matrix file argument, skipping that part of the test\n");
    }

    print_matrix(&parasail_blosum62);
    print_mapper(&parasail_blosum62);

    internal_matrix = parasail_matrix_lookup("blosum62");
    if (NULL == internal_matrix) {
        fprintf(stderr, "matrix lookup failed");
        exit(EXIT_FAILURE);
    }

    user_matrix = parasail_matrix_create("ACGT", 2, -1);
    if (NULL == user_matrix) {
        fprintf(stderr, "matrix create failed");
        exit(EXIT_FAILURE);
    }
    print_matrix(user_matrix);
    print_mapper(user_matrix);
    parasail_matrix_free(user_matrix);

    user_matrix = parasail_matrix_create_case_sensitive("AcgT", 2, -1);
    if (NULL == user_matrix) {
        fprintf(stderr, "matrix create failed");
        exit(EXIT_FAILURE);
    }
    print_matrix(user_matrix);
    print_mapper(user_matrix);
    parasail_matrix_free(user_matrix);

    user_matrix = parasail_matrix_create_case_sensitive("ACGTacgt", 2, -1);
    if (NULL == user_matrix) {
        fprintf(stderr, "matrix create failed");
        exit(EXIT_FAILURE);
    }
    print_matrix(user_matrix);
    print_mapper(user_matrix);
    parasail_matrix_free(user_matrix);

    user_matrix = parasail_matrix_copy(internal_matrix);
    if (NULL == user_matrix) {
        fprintf(stderr, "matrix copy failed");
        exit(EXIT_FAILURE);
    }

    parasail_matrix_set_value(user_matrix, 10, 10, 100);
    if (100 != user_matrix->max) {
        fprintf(stderr, "matrix set value failed");
        exit(EXIT_FAILURE);
    }

    parasail_matrix_free(user_matrix);

    user_matrix = parasail_matrix_pssm_create(
            pssm_alphabet,
            pssm_values,
            pssm_length);
    if (NULL == user_matrix) {
        fprintf(stderr, "pssm matrix create failed");
        exit(EXIT_FAILURE);
    }
    print_matrix(user_matrix);
    print_mapper(user_matrix);

    user_matrix_copy = parasail_matrix_copy(user_matrix);
    if (NULL == user_matrix_copy) {
        fprintf(stderr, "pssm matrix copy failed");
        exit(EXIT_FAILURE);
    }
    parasail_matrix_free(user_matrix);

    print_matrix(user_matrix_copy);
    print_mapper(user_matrix_copy);
    parasail_matrix_free(user_matrix_copy);

    user_matrix = parasail_matrix_convert_square_to_pssm(internal_matrix, "asdf", 4);
    print_matrix(user_matrix);
    print_mapper(user_matrix);
    parasail_matrix_free(user_matrix);

    print_matrix(internal_matrix);

    return 0;
}